

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  ImGuiContext *pIVar1;
  ImGuiInputEvent *pIVar2;
  byte in_SIL;
  ImGuiInputEvent e;
  bool latest_focused;
  ImGuiInputEvent *latest_event;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  int in_stack_ffffffffffffffc8;
  ImGuiInputEventType in_stack_ffffffffffffffcc;
  
  pIVar1 = GImGui;
  pIVar2 = FindLatestInputEvent(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  if (pIVar2 == (ImGuiInputEvent *)0x0) {
    uVar3 = CONCAT13((pIVar1->IO).AppFocusLost,(int3)in_stack_ffffffffffffffc0) ^ 0xff000000;
  }
  else {
    uVar3 = CONCAT13((pIVar2->field_2).AppFocused.Focused,(int3)in_stack_ffffffffffffffc0);
  }
  if (((byte)(uVar3 >> 0x18) & 1) != (in_SIL & 1)) {
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x4ad8a6);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)CONCAT44(6,uVar3),in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Focus);
    const bool latest_focused = latest_event ? latest_event->AppFocused.Focused : !g.IO.AppFocusLost;
    if (latest_focused == focused)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}